

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::String::CaseInsensitiveWideCStringEquals(wchar_t *lhs,wchar_t *rhs)

{
  int iVar1;
  wchar_t *rhs_local;
  wchar_t *lhs_local;
  
  if (lhs == (wchar_t *)0x0) {
    lhs_local._7_1_ = rhs == (wchar_t *)0x0;
  }
  else if (rhs == (wchar_t *)0x0) {
    lhs_local._7_1_ = false;
  }
  else {
    iVar1 = wcscasecmp(lhs,rhs);
    lhs_local._7_1_ = iVar1 == 0;
  }
  return lhs_local._7_1_;
}

Assistant:

bool String::CaseInsensitiveWideCStringEquals(const wchar_t* lhs,
                                              const wchar_t* rhs) {
  if (lhs == NULL) return rhs == NULL;

  if (rhs == NULL) return false;

#if GTEST_OS_WINDOWS
  return _wcsicmp(lhs, rhs) == 0;
#elif GTEST_OS_LINUX
  return wcscasecmp(lhs, rhs) == 0;
#else
  // Mac OS X and Cygwin don't define wcscasecmp.  Other unknown OSes
  // may not define it either.
  wint_t left, right;
  do {
    left = towlower(*lhs++);
    right = towlower(*rhs++);
  } while (left && left == right);
  return left == right;
#endif  // OS selector
}